

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O3

void __thiscall PingClient::~PingClient(PingClient *this)

{
  Dashel::Hub::~Hub(&this->super_Hub);
  operator_delete(this,0x80);
  return;
}

Assistant:

PingClient(const string& remoteTarget, const string& msg)
	{
		PacketStream* packetStream = dynamic_cast<PacketStream*>(connect("udp:port=8766"));
		assert(packetStream);

		packetStream->write(msg.c_str(), msg.length());
		char c = 0;
		packetStream->write(&c, 1);

		packetStream->send(IPV4Address(remoteTarget, 8765));
	}